

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O2

void __thiscall
priorityQueueTest_crossing_data_Test::TestBody(priorityQueueTest_crossing_data_Test *this)

{
  double dVar1;
  bool bVar2;
  T *pTVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AssertHelper local_98;
  AssertionResult gtest_ar;
  priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> std_pq;
  Priority_queue pq;
  
  std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  pq._20_8_ = 0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = 0;
  iVar6 = 0;
  for (iVar4 = 0; iVar4 != -100000; iVar4 = iVar4 + -1) {
    gtest_ar._0_8_ = (double)iVar6;
    std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
    push(&std_pq,(value_type *)&gtest_ar);
    gtest_ar._0_8_ = (double)iVar6;
    Priority_queue::push(&pq,(T *)&gtest_ar);
    gtest_ar._0_8_ = (double)iVar4;
    std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
    push(&std_pq,(value_type *)&gtest_ar);
    gtest_ar._0_8_ = (double)iVar4;
    Priority_queue::push(&pq,(T *)&gtest_ar);
    dVar1 = *std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar3 = Priority_queue::top(&pq);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar,"std_pq.top()","pq.top()",dVar1,*pTVar3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x7b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      goto LAB_001259ea;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_a0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3);
    local_98.data_ = (AssertHelperData *)Priority_queue::size(&pq);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"std_pq.size()","pq.size()",(unsigned_long *)&local_a0,
               (unsigned_long *)&local_98);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x7c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      goto LAB_001259ea;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    iVar6 = iVar6 + 1;
  }
  local_a0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3);
  local_98.data_ = (AssertHelperData *)Priority_queue::size(&pq);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"std_pq.size()","pq.size()",(unsigned_long *)&local_a0,
             (unsigned_long *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
               ,0x7e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    while (bVar2 = Priority_queue::empty(&pq), !bVar2) {
      dVar1 = *std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar3 = Priority_queue::top(&pq);
      testing::internal::CmpHelperFloatingPointEQ<double>
                ((internal *)&gtest_ar,"std_pq.top()","pq.top()",dVar1,*pTVar3);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_a0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                   ,0x80,pcVar5);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_a0);
        goto LAB_00125ba9;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
      ::pop(&std_pq);
      Priority_queue::pop(&pq);
    }
    local_a0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Priority_queue::size(&pq);
    local_98.data_ = local_98.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar,"pq.size()","0",(unsigned_long *)&local_a0,(int *)&local_98);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3);
      local_98.data_ = local_98.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&gtest_ar,"std_pq.size()","0",(unsigned_long *)&local_a0,
                 (int *)&local_98);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_a0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                   ,0x85,pcVar5);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
LAB_001259ea:
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_a0);
      }
      goto LAB_00125ba9;
    }
    testing::Message::Message((Message *)&local_a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
               ,0x84,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_a0);
LAB_00125ba9:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Priority_queue::~Priority_queue(&pq);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&std_pq);
  return;
}

Assistant:

TEST_F(priorityQueueTest, crossing_data) {
    std::priority_queue<double> std_pq;
    Priority_queue pq;
    for (int i = 0; i != 100000; ++i) {
        std_pq.push((double) i);
        pq.push((double) i);
        std_pq.push((double) -i);
        pq.push((double) -i);
        ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
        ASSERT_EQ(std_pq.size(), pq.size());
    }
    ASSERT_EQ(std_pq.size(), pq.size());
    while (!pq.empty()) {
        ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
        std_pq.pop();
        pq.pop();
    }
    ASSERT_EQ(pq.size(), 0);
    ASSERT_EQ(std_pq.size(), 0);
}